

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::vector
          (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this,
          vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *other,
          polymorphic_allocator<pbrt::Half> *alloc)

{
  Half *pHVar1;
  size_t sVar2;
  Half *pHVar3;
  size_t sVar4;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (Half *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,other->nStored);
  pHVar1 = other->ptr;
  sVar2 = other->nStored;
  pHVar3 = this->ptr;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    pHVar3[sVar4].h = pHVar1[sVar4].h;
  }
  this->nStored = sVar2;
  return;
}

Assistant:

vector(const vector &other, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            this->alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();
    }